

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::OptionNotFound::OptionNotFound(OptionNotFound *this,string *msg,ExitCodes exit_code)

{
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39 [5];
  ExitCodes in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  Error *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff90;
  ::std::__cxx11::string::string
            (in_stack_ffffffffffffffb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8);
  Error::Error(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator(local_39);
  *in_RDI = &PTR__OptionNotFound_00a5bbf8;
  return;
}

Assistant:

explicit OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}